

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void play_ambient_sound(void)

{
  _Bool _Var1;
  
  if (player->depth == 0) {
    _Var1 = is_daytime();
    if (_Var1) {
      sound(0x83);
    }
    else {
      sound(0x84);
    }
  }
  else if (player->depth < 0x15) {
    sound(0x85);
  }
  else if (player->depth < 0x29) {
    sound(0x86);
  }
  else if (player->depth < 0x3d) {
    sound(0x87);
  }
  else if (player->depth < 0x51) {
    sound(0x88);
  }
  else {
    sound(0x89);
  }
  return;
}

Assistant:

void play_ambient_sound(void)
{
	if (player->depth == 0) {
		if (is_daytime())
			sound(MSG_AMBIENT_DAY);
		else 
			sound(MSG_AMBIENT_NITE);
	} else if (player->depth <= 20) {
		sound(MSG_AMBIENT_DNG1);
	} else if (player->depth <= 40) {
		sound(MSG_AMBIENT_DNG2);
	} else if (player->depth <= 60) {
		sound(MSG_AMBIENT_DNG3);
	} else if (player->depth <= 80) {
		sound(MSG_AMBIENT_DNG4);
	} else {
		sound(MSG_AMBIENT_DNG5);
	}
}